

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uchar local_238 [4];
  int ret;
  uchar seckey [32];
  uchar pk_buf [32];
  uchar buf [32];
  undefined1 local_1d0 [8];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar k;
  secp256k1_scalar e;
  secp256k1_scalar sk;
  secp256k1_nonce_function_hardened noncefp_local;
  secp256k1_keypair *keypair_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *sig64_local;
  secp256k1_context *ctx_local;
  
  memset(pk_buf + 0x18,0,0x20);
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig64 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg == (uchar *)0x0 && msglen != 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg != NULL || msglen == 0");
    ctx_local._4_4_ = 0;
  }
  else if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"keypair != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    sk.d[3] = (uint64_t)noncefp;
    if (noncefp == (secp256k1_nonce_function_hardened)0x0) {
      sk.d[3] = (uint64_t)nonce_function_bip340;
    }
    uVar2 = secp256k1_keypair_load
                      (ctx,(secp256k1_scalar *)(e.d + 3),(secp256k1_ge *)&r.infinity,keypair);
    iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)(pk.x.n + 4));
    if (iVar1 != 0) {
      secp256k1_scalar_negate((secp256k1_scalar *)(e.d + 3),(secp256k1_scalar *)(e.d + 3));
    }
    secp256k1_scalar_get_b32(local_238,(secp256k1_scalar *)(e.d + 3));
    secp256k1_fe_get_b32(seckey + 0x18,(secp256k1_fe *)&r.infinity);
    iVar1 = (*(code *)sk.d[3])(pk_buf + 0x18,msg,msglen,local_238,seckey + 0x18,"BIP0340/nonce",0xd,
                               ndata);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&rj.infinity,pk_buf + 0x18,(int *)0x0);
    iVar3 = secp256k1_scalar_is_zero((secp256k1_scalar *)&rj.infinity);
    ctx_local._4_4_ = (uint)((iVar3 != 0 ^ 0xffU) & 1) & (uint)(iVar1 != 0) & uVar2 & 1;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)&rj.infinity,&secp256k1_scalar_one,
               (uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_ecmult_gen
              (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&pk.infinity,(secp256k1_scalar *)&rj.infinity);
    secp256k1_ge_set_gej((secp256k1_ge *)local_1d0,(secp256k1_gej *)&pk.infinity);
    secp256k1_declassify(ctx,local_1d0,0x58);
    secp256k1_fe_normalize_var((secp256k1_fe *)(r.x.n + 4));
    iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)(r.x.n + 4));
    if (iVar1 != 0) {
      secp256k1_scalar_negate((secp256k1_scalar *)&rj.infinity,(secp256k1_scalar *)&rj.infinity);
    }
    secp256k1_fe_normalize_var((secp256k1_fe *)local_1d0);
    secp256k1_fe_get_b32(sig64,(secp256k1_fe *)local_1d0);
    secp256k1_schnorrsig_challenge((secp256k1_scalar *)(k.d + 3),sig64,msg,msglen,seckey + 0x18);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)(k.d + 3),(secp256k1_scalar *)(k.d + 3),
               (secp256k1_scalar *)(e.d + 3));
    secp256k1_scalar_add
              ((secp256k1_scalar *)(k.d + 3),(secp256k1_scalar *)(k.d + 3),
               (secp256k1_scalar *)&rj.infinity);
    secp256k1_scalar_get_b32(sig64 + 0x20,(secp256k1_scalar *)(k.d + 3));
    secp256k1_memczero(sig64,0x40,(uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_clear((secp256k1_scalar *)&rj.infinity);
    secp256k1_scalar_clear((secp256k1_scalar *)(e.d + 3));
    memset(local_238,0,0x20);
  }
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}